

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssignStmt *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  VarType VVar1;
  PortDirection PVar2;
  int iVar3;
  Var **ppVVar4;
  element_type *this_00;
  undefined4 extraout_var;
  StmtException *this_01;
  allocator<kratos::IRNode_*> local_a1;
  IRNode *local_a0;
  Var *local_98;
  Var *local_90;
  iterator local_88;
  size_type local_80;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_78;
  allocator<char> local_59;
  string local_58;
  undefined1 local_28 [8];
  shared_ptr<kratos::Port> port;
  AssignStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stmt;
  ppVVar4 = AssignStmt::left(stmt);
  VVar1 = Var::type(*ppVVar4);
  if (VVar1 == PortIO) {
    AssignStmt::left((AssignStmt *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
    Var::as<kratos::Port>((Var *)local_28);
    this_00 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    PVar2 = Port::port_direction(this_00);
    if (PVar2 == In) {
      ppVVar4 = AssignStmt::left((AssignStmt *)
                                 port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
      iVar3 = (*((*ppVVar4)->super_IRNode)._vptr_IRNode[0xd])();
      if ((Generator *)CONCAT44(extraout_var,iVar3) == this->generator_) {
        ppVVar4 = AssignStmt::right((AssignStmt *)
                                    port.
                                    super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi);
        VVar1 = Var::type(*ppVVar4);
        if (VVar1 != ConstValue) {
          this_01 = (StmtException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"Cannot drive a module\'s input from itself",&local_59);
          local_a0 = (IRNode *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
          ppVVar4 = AssignStmt::left((AssignStmt *)
                                     port.
                                     super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi);
          local_98 = *ppVVar4;
          ppVVar4 = AssignStmt::right((AssignStmt *)
                                      port.
                                      super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi);
          local_90 = *ppVVar4;
          local_88 = &local_a0;
          local_80 = 3;
          std::allocator<kratos::IRNode_*>::allocator(&local_a1);
          __l._M_len = local_80;
          __l._M_array = local_88;
          std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                    (&local_78,__l,&local_a1);
          StmtException::StmtException(this_01,&local_58,&local_78);
          __cxa_throw(this_01,&StmtException::typeinfo,StmtException::~StmtException);
        }
      }
    }
    std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_28);
  }
  Stream::operator<<(&this->stream_,
                     (AssignStmt *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssignStmt* stmt) {
    if (stmt->left()->type() == VarType::PortIO) {
        auto port = stmt->left()->as<Port>();
        if (port->port_direction() == PortDirection::In &&
            stmt->left()->generator() == generator_ &&
            stmt->right()->type() != VarType::ConstValue) {
            throw StmtException("Cannot drive a module's input from itself",
                                {stmt, stmt->left(), stmt->right()});
        }
    }
    stream_ << stmt;
}